

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

AssertionPortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  AssertionPortSymbol *parent;
  
  parent = (AssertionPortSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AssertionPortSymbol *)this->endPtr < parent + 1) {
    parent = (AssertionPortSymbol *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(parent + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (parent->super_Symbol).kind = AssertionPort;
  (parent->super_Symbol).name._M_len = sVar2;
  (parent->super_Symbol).name._M_str = pcVar3;
  (parent->super_Symbol).location = SVar1;
  (parent->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (parent->super_Symbol).parentScope = (Scope *)0x0;
  (parent->super_Symbol).nextInScope = (Symbol *)0x0;
  (parent->super_Symbol).indexInScope = 0;
  ast::DeclaredType::DeclaredType
            (&parent->declaredType,&parent->super_Symbol,(bitmask<slang::ast::DeclaredTypeFlags>)0x0
            );
  parent->defaultValueSyntax = (PropertyExprSyntax *)0x0;
  (parent->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged = false;
  return parent;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }